

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  string *psVar1;
  _Alloc_hider _Var2;
  string normalizedComment;
  string local_60;
  string local_40;
  
  if ((root->comments_ != (CommentInfo *)0x0) && (root->comments_->comment_ != (char *)0x0)) {
    psVar1 = &this->document_;
    std::__cxx11::string::append((char *)psVar1);
    writeIndent(this);
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    normalizeEOL(&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    for (_Var2._M_p = local_60._M_dataplus._M_p;
        _Var2._M_p != local_60._M_dataplus._M_p + local_60._M_string_length;
        _Var2._M_p = _Var2._M_p + 1) {
      std::__cxx11::string::push_back((char)psVar1);
      if ((*_Var2._M_p == '\n') && (_Var2._M_p[1] == '/')) {
        writeIndent(this);
      }
    }
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

bool Value::hasComment(CommentPlacement placement) const {
  return comments_ != 0 && comments_[placement].comment_ != 0;
}